

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

uint add_not_list_to_class
               (uint8_t *classbits,PCRE2_UCHAR8 **uchardptr,uint32_t options,uint32_t xoptions,
               compile_block_8 *cb,uint32_t *p)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t xoptions_00;
  undefined4 in_register_0000000c;
  uint32_t *puVar4;
  undefined8 unaff_RBX;
  uint32_t start;
  
  start = (uint32_t)p;
  puVar4 = (uint32_t *)CONCAT44(in_register_0000000c,xoptions);
  if (*puVar4 != 0) {
    add_to_class(classbits,(PCRE2_UCHAR8 **)((ulong)uchardptr & 0xffffffff),options,0,
                 (compile_block_8 *)(ulong)(*puVar4 - 1),start,(uint32_t)unaff_RBX);
  }
  while (uVar3 = *puVar4, *puVar4 != 0xffffffff) {
    do {
      uVar1 = puVar4[1];
      puVar4 = puVar4 + 1;
      xoptions_00 = uVar3 + 1;
      uVar3 = uVar1;
    } while (uVar1 == xoptions_00);
    uVar2 = uVar1 - 1;
    if (uVar1 == 0xffffffff) {
      uVar2 = (((uint)uchardptr >> 0x13 & 1) != 0) - 1 | 0x10ffff;
    }
    add_to_class(classbits,(PCRE2_UCHAR8 **)((ulong)uchardptr & 0xffffffff),options,xoptions_00,
                 (compile_block_8 *)(ulong)uVar2,start,(uint32_t)unaff_RBX);
  }
  return 0xffffffff;
}

Assistant:

static unsigned int
add_not_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr,
  uint32_t options, uint32_t xoptions, compile_block *cb, const uint32_t *p)
{
BOOL utf = (options & PCRE2_UTF) != 0;
unsigned int n8 = 0;
if (p[0] > 0)
  n8 += add_to_class(classbits, uchardptr, options, xoptions, cb, 0, p[0] - 1);
while (p[0] < NOTACHAR)
  {
  while (p[1] == p[0] + 1) p++;
  n8 += add_to_class(classbits, uchardptr, options, xoptions, cb, p[0] + 1,
    (p[1] == NOTACHAR) ? (utf ? 0x10ffffu : 0xffffffffu) : p[1] - 1);
  p++;
  }
return n8;
}